

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void hash_element_dtor(void *user,void *element)

{
  if (*(long *)((long)element + 0x20) != 0) {
    if (*(code **)((long)element + 0x28) == (code *)0x0) {
      (**(code **)((long)user + 0x18))(*(long *)((long)element + 0x20));
    }
    else {
      (**(code **)((long)element + 0x28))
                ((long)element + 0x38,*(undefined8 *)((long)element + 0x30));
    }
    *(undefined8 *)((long)element + 0x20) = 0;
  }
  *(undefined8 *)((long)element + 0x30) = 0;
  (*Curl_cfree)(element);
  return;
}

Assistant:

static void
hash_element_dtor(void *user, void *element)
{
  struct Curl_hash *h = (struct Curl_hash *) user;
  struct Curl_hash_element *e = (struct Curl_hash_element *) element;

  if(e->ptr) {
    if(e->dtor)
      e->dtor(e->key, e->key_len, e->ptr);
    else
      h->dtor(e->ptr);
    e->ptr = NULL;
  }

  e->key_len = 0;

  free(e);
}